

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

real __thiscall
fasttext::NegativeSamplingLoss::forward
          (NegativeSamplingLoss *this,vector<int,_std::allocator<int>_> *targets,int32_t targetIndex
          ,State *state,real lr,bool backprop)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  NegativeSamplingLoss *in_RCX;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_RDI;
  undefined1 in_R8B;
  int32_t in_XMM0_Da;
  float lr_00;
  real rVar4;
  int32_t negativeTarget;
  int32_t n;
  real loss;
  int32_t target;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar5;
  real in_stack_ffffffffffffffd0;
  value_type vVar6;
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar7 = CONCAT13(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffff;
  if (in_EDX < 0) {
    __assert_fail("targetIndex >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/loss.cc"
                  ,0xb3,
                  "virtual real fasttext::NegativeSamplingLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
                 );
  }
  uVar1 = (ulong)in_EDX;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  if (uVar1 < sVar2) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)in_EDX);
    vVar6 = *pvVar3;
    lr_00 = BinaryLogisticLoss::binaryLogistic
                      ((BinaryLogisticLoss *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                       (int32_t)((ulong)in_RCX >> 0x20),(State *)CONCAT44(in_XMM0_Da,uVar7),
                       SUB41((uint)vVar6 >> 0x18,0),in_stack_ffffffffffffffd0,
                       SUB41((uint)in_stack_ffffffffffffffcc >> 0x18,0));
    for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x40); iVar5 = iVar5 + 1) {
      getNegative(in_RCX,in_XMM0_Da,(minstd_rand *)CONCAT44(vVar6,lr_00));
      rVar4 = BinaryLogisticLoss::binaryLogistic
                        ((BinaryLogisticLoss *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                         (int32_t)((ulong)in_RCX >> 0x20),(State *)CONCAT44(in_XMM0_Da,uVar7),
                         SUB41((uint)vVar6 >> 0x18,0),lr_00,SUB41((uint)iVar5 >> 0x18,0));
      lr_00 = rVar4 + lr_00;
    }
    return lr_00;
  }
  __assert_fail("targetIndex < targets.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/loss.cc"
                ,0xb4,
                "virtual real fasttext::NegativeSamplingLoss::forward(const std::vector<int32_t> &, int32_t, Model::State &, real, bool)"
               );
}

Assistant:

real NegativeSamplingLoss::forward(
    const std::vector<int32_t>& targets,
    int32_t targetIndex,
    Model::State& state,
    real lr,
    bool backprop) {
  assert(targetIndex >= 0);
  assert(targetIndex < targets.size());
  int32_t target = targets[targetIndex];
  real loss = binaryLogistic(target, state, true, lr, backprop);

  for (int32_t n = 0; n < neg_; n++) {
    auto negativeTarget = getNegative(target, state.rng);
    loss += binaryLogistic(negativeTarget, state, false, lr, backprop);
  }
  return loss;
}